

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
* __thiscall adios2::core::Engine::DoAllStepsBlocksInfoStruct(Engine *this,VariableStruct *variable)

{
  map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
  *in_RDI;
  string *in_stack_00000098;
  Engine *in_stack_000000a0;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"DoAllStepsBlocksInfo",&local_39);
  ThrowUp(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  memset(in_RDI,0,0x30);
  std::
  map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
         *)0x853f01);
  return in_RDI;
}

Assistant:

std::map<size_t, std::vector<VariableStruct::BPInfo>>
Engine::DoAllStepsBlocksInfoStruct(const VariableStruct &variable) const
{
    ThrowUp("DoAllStepsBlocksInfo");
    return std::map<size_t, std::vector<VariableStruct::BPInfo>>();
}